

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_are_all_used_components_decoded(opj_j2k_t *p_j2k,opj_event_mgr_t *p_manager)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar2 = (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
  bVar1 = true;
  if (uVar2 == 0) {
    lVar4 = 0x30;
    for (uVar3 = 0; uVar3 < p_j2k->m_output_image->numcomps; uVar3 = uVar3 + 1) {
      if (*(long *)((long)&p_j2k->m_output_image->comps->dx + lVar4) == 0) {
        bVar1 = false;
        opj_event_msg(p_manager,2,"Failed to decode component %d\n",uVar3 & 0xffffffff);
      }
      lVar4 = lVar4 + 0x40;
    }
  }
  else {
    for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      if (p_j2k->m_output_image->comps
          [(p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode[uVar3]].data ==
          (OPJ_INT32 *)0x0) {
        bVar1 = false;
        opj_event_msg(p_manager,2,"Failed to decode component %d\n");
        uVar2 = (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
      }
    }
  }
  if (!bVar1) {
    opj_event_msg(p_manager,1,"Failed to decode all used components\n");
  }
  return (uint)bVar1;
}

Assistant:

static OPJ_BOOL opj_j2k_are_all_used_components_decoded(opj_j2k_t *p_j2k,
        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 compno;
    OPJ_BOOL decoded_all_used_components = OPJ_TRUE;

    if (p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode) {
        for (compno = 0;
                compno < p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode; compno++) {
            OPJ_UINT32 dec_compno =
                p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode[compno];
            if (p_j2k->m_output_image->comps[dec_compno].data == NULL) {
                opj_event_msg(p_manager, EVT_WARNING, "Failed to decode component %d\n",
                              dec_compno);
                decoded_all_used_components = OPJ_FALSE;
            }
        }
    } else {
        for (compno = 0; compno < p_j2k->m_output_image->numcomps; compno++) {
            if (p_j2k->m_output_image->comps[compno].data == NULL) {
                opj_event_msg(p_manager, EVT_WARNING, "Failed to decode component %d\n",
                              compno);
                decoded_all_used_components = OPJ_FALSE;
            }
        }
    }

    if (decoded_all_used_components == OPJ_FALSE) {
        opj_event_msg(p_manager, EVT_ERROR, "Failed to decode all used components\n");
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}